

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O0

uchar ** traverse<void(*)(unsigned_char**,int,int),vector_brodnik<unsigned_char*>,unsigned_char>
                   (TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *node,uchar **dst,
                   size_t depth,_func_void_uchar_ptr_ptr_int_int *small_sort)

{
  vector_brodnik<unsigned_char_*> *this;
  bool bVar1;
  size_type sVar2;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *node_00;
  reference ppvVar3;
  size_t sVar4;
  size_t bsize;
  vector_brodnik<unsigned_char_*> *bucket;
  uint i;
  _func_void_uchar_ptr_ptr_int_int *small_sort_local;
  size_t depth_local;
  uchar **dst_local;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *node_local;
  
  depth_local = (size_t)dst;
  for (bucket._4_4_ = 0; sVar2 = std::vector<void_*,_std::allocator<void_*>_>::size(&node->_buckets)
      , bucket._4_4_ < sVar2; bucket._4_4_ = bucket._4_4_ + 1) {
    bVar1 = TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::is_trie(node,bucket._4_4_);
    if (bVar1) {
      node_00 = TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::get_node
                          (node,bucket._4_4_);
      depth_local = (size_t)traverse<void(*)(unsigned_char**,int,int),vector_brodnik<unsigned_char*>,unsigned_char>
                                      (node_00,(uchar **)depth_local,depth + 1,small_sort);
    }
    else {
      ppvVar3 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (&node->_buckets,(ulong)bucket._4_4_);
      this = (vector_brodnik<unsigned_char_*> *)*ppvVar3;
      if (this != (vector_brodnik<unsigned_char_*> *)0x0) {
        sVar4 = vector_brodnik<unsigned_char_*>::size(this);
        copy<unsigned_char*,unsigned_char**>(this,(uchar **)depth_local);
        bVar1 = is_end<unsigned_int>(bucket._4_4_);
        if (!bVar1) {
          (*small_sort)((uchar **)depth_local,(int)sVar4,(int)depth);
        }
        depth_local = sVar4 * 8 + depth_local;
        if (this != (vector_brodnik<unsigned_char_*> *)0x0) {
          vector_brodnik<unsigned_char_*>::~vector_brodnik(this);
          operator_delete(this);
        }
      }
    }
  }
  if (node != (TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *)0x0) {
    TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::~TrieNode(node);
    operator_delete(node);
  }
  return (uchar **)depth_local;
}

Assistant:

static unsigned char**
traverse(TrieNode<CharT, BucketT>* node,
         unsigned char** dst,
         size_t depth,
         SmallSort small_sort)
{
	for (unsigned i=0; i < node->_buckets.size(); ++i) {
		if (node->is_trie(i)) {
			dst = traverse(node->get_node(i),
				dst, depth+sizeof(CharT), small_sort);
		} else {
			BucketT* bucket =
				static_cast<BucketT*>(node->_buckets[i]);
			if (not bucket) continue;
			size_t bsize = bucket->size();
			copy(*bucket, dst);
			if (not is_end(i)) small_sort(dst, bsize, depth);
			dst += bsize;
			delete bucket;
		}
	}
	delete node;
	return dst;
}